

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFNode.cpp
# Opt level: O0

int __thiscall FFNode::init(FFNode *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined7 extraout_var;
  reference pfVar2;
  result_type rVar3;
  double dVar4;
  num_t *b;
  iterator __end1_1;
  iterator __begin1_1;
  vector<float,_std::allocator<float>_> *__range1_1;
  num_t *w;
  iterator __end1;
  iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  normal_distribution<float> dist;
  num_t sigma;
  rne_t *rne_local;
  FFNode *this_local;
  
  unique0x1000019d =
       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
        *)ctx;
  if (this->activation_ == ReLU) {
    dVar4 = sqrt(2.0 / (double)this->input_size_);
  }
  else {
    dVar4 = sqrt(1.0 / (double)this->input_size_);
  }
  dist._M_saved = (result_type)dVar4;
  std::normal_distribution<float>::normal_distribution
            ((normal_distribution<float> *)((long)&__range1 + 4),0.0,dist._M_saved);
  __end1 = std::vector<float,_std::allocator<float>_>::begin(&this->weights_);
  w = (num_t *)std::vector<float,_std::allocator<float>_>::end(&this->weights_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                     *)&w), bVar1) {
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1);
    rVar3 = std::normal_distribution<float>::operator()
                      ((normal_distribution<float> *)((long)&__range1 + 4),stack0xffffffffffffffe8);
    *pfVar2 = rVar3;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<float,_std::allocator<float>_>::begin(&this->biases_);
  b = (num_t *)std::vector<float,_std::allocator<float>_>::end(&this->biases_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)&b
                      );
    if (!bVar1) break;
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&__end1_1);
    *pfVar2 = 0.01;
    __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
              (&__end1_1);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void FFNode::init(rne_t& rne)
{
    num_t sigma;
    switch (activation_)
    {
    case Activation::ReLU:
        // Kaiming He, et. al. weight initialization for ReLU networks
        // https://arxiv.org/pdf/1502.01852.pdf
        //
        // Suggests using a normal distribution with variance := 2 / n_in
        sigma = std::sqrt(2.0 / static_cast<num_t>(input_size_));
        break;
    case Activation::Softmax:
    default:
        sigma = std::sqrt(1.0 / static_cast<num_t>(input_size_));
        break;
    }

    // NOTE: Unfortunately, the C++ standard does not guarantee that the results
    // obtained from a distribution function will be identical given the same
    // inputs across different compilers and platforms. A production ML
    // framework will likely implement its own distributions to provide
    // deterministic results.
    auto dist = std::normal_distribution<num_t>{0.0, sigma};

    for (num_t& w : weights_)
    {
        w = dist(rne);
    }

    // NOTE: Setting biases to zero is a common practice, as is initializing the
    // bias to a small value (e.g. on the order of 0.01). It is unclear if the
    // latter produces a consistent result over the former, but the thinking is
    // that a non-zero bias will ensure that the neuron always "fires" at the
    // beginning to produce a signal.
    //
    // Here, we initialize all biases to a small number, but the reader should
    // consider experimenting with other approaches.
    for (num_t& b : biases_)
    {
        b = 0.01;
    }
}